

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O1

error_or_n<int,_byte_span> * __thiscall
pstore::http::
buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>_>
::get_span_impl(error_or_n<int,_byte_span> *__return_storage_ptr__,
               buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
               *this,int io,byte_span *sp)

{
  maybe<unsigned_char,_void> *this_00;
  span<unsigned_char,__1L> *psVar1;
  pointer peVar2;
  anon_struct_8_0_00000001_for___align aVar3;
  bool bVar4;
  bool bVar5;
  uchar *puVar6;
  tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>
  *ptVar7;
  tuple<int,_pstore::gsl::span<unsigned_char,__1L>_> *ptVar8;
  anon_struct_8_0_00000001_for___align *paVar9;
  error_code *peVar10;
  long __n2;
  extent_type<_1L> eVar11;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *this_01;
  span<unsigned_char,__1L> *span;
  error_code eVar12;
  error_or_n<int,_gsl::span<std::uint8_t>::iterator> x;
  _Head_base<0UL,_int,_false> local_dc;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_d8;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_c8;
  error_or_n<int,_byte_span> *local_b8;
  byte_span *local_b0;
  span<unsigned_char,__1L> *local_a8;
  anon_union_24_2_eb5a95ea_for_error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_1
  local_a0;
  char local_88;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *local_80;
  pointer local_78;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_70;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_60;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_50;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_40;
  
  local_c8 = sp->storage_;
  local_b8 = __return_storage_ptr__;
  if (((this->push_).valid_ == true) && (0 < (sp->storage_).super_extent_type<_1L>.size_)) {
    this_00 = &this->push_;
    puVar6 = maybe<unsigned_char,_void>::operator->(this_00);
    if ((sp->storage_).super_extent_type<_1L>.size_ < 1) {
LAB_00125498:
      assert_failed("idx >= 0 && idx < storage_.size ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                    ,0x18a);
    }
    *(sp->storage_).data_ = *puVar6;
    if (this_00->valid_ == true) {
      this_00->valid_ = false;
    }
    local_c8 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               pstore::gsl::span<unsigned_char,_-1L>::subspan
                         ((span<unsigned_char,__1L> *)&local_c8,1,-1);
  }
  local_dc._M_head_impl = io;
  local_b0 = sp;
  if (local_c8.super_extent_type<_1L>.size_ != 0) {
    this_01 = &this->pos_;
    span = &this->span_;
    local_a8 = span;
    local_80 = this_01;
    do {
      if (this->is_eof_ != false) break;
      if (((this->pos_).span_ == (this->end_).span_) && ((this->pos_).index_ == (this->end_).index_)
         ) {
        local_d8.span_._0_4_ = local_dc._M_head_impl;
        if ((this->refill_).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
          goto LAB_00125498;
        }
        (*(this->refill_)._M_invoker)
                  ((error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                    *)&local_a0,(_Any_data *)this,(int *)&local_d8,span);
        if (local_88 == '\x01') {
          eVar12 = error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
                   ::get_error((error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                                *)&local_a0);
          local_b8->has_error_ = true;
          peVar10 = error_or<std::tuple<int,pstore::gsl::span<unsigned_char,-1l>>>::
                    error_storage_impl<pstore::error_or<std::tuple<int,pstore::gsl::span<unsigned_char,_1l>>>&,std::error_code>
                              (local_b8);
          peVar10->_M_value = eVar12._M_value;
          peVar10->_M_cat = eVar12._M_cat;
          if (local_88 != '\0') {
            error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
            ::
            error_storage_impl<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::error_code>
                      ((error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                        *)&local_a0);
            return local_b8;
          }
          error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
          ::
          value_storage_impl<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
                    ((error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                      *)&local_a0);
          return local_b8;
        }
        ptVar7 = error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
                 ::
                 value_storage_impl<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
                           ((error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                             *)&local_a0);
        local_dc._M_head_impl =
             (ptVar7->
             super__Tuple_impl<0UL,_int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>
             ).super__Head_base<0UL,_int,_false>._M_head_impl;
        ptVar7 = error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
                 ::
                 value_storage_impl<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
                           ((error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                             *)&local_a0);
        pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
        span_iterator(&local_d8,span,0);
        psVar1 = (ptVar7->
                 super__Tuple_impl<0UL,_int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>
                 ).
                 super__Tuple_impl<1UL,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>
                 .
                 super__Head_base<1UL,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>,_false>
                 ._M_head_impl.span_;
        peVar2 = (pointer)(ptVar7->
                          super__Tuple_impl<0UL,_int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>
                          ).
                          super__Tuple_impl<1UL,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>
                          .
                          super__Head_base<1UL,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>,_false>
                          ._M_head_impl.index_;
        bVar4 = (pointer)local_d8.index_ == peVar2;
        bVar5 = (span<unsigned_char,__1L> *)CONCAT44(local_d8.span_._4_4_,(int)local_d8.span_) ==
                psVar1;
        if (bVar4 && bVar5) {
          this->is_eof_ = true;
          peVar2 = (local_b0->storage_).data_;
          pstore::gsl::details::extent_type<-1L>::extent_type
                    ((extent_type<_1L> *)&local_d8,(long)local_c8.data_ - (long)peVar2);
          local_b8->has_error_ = false;
          local_d8.index_ = (ptrdiff_t)peVar2;
          ptVar8 = error_or<std::tuple<int,pstore::gsl::span<unsigned_char,-1l>>>::
                   value_storage_impl<pstore::error_or<std::tuple<int,pstore::gsl::span<unsigned_char,_1l>>>&,std::tuple<int,pstore::gsl::span<unsigned_char,_1l>>>
                             (local_b8);
          eVar11.size_._4_4_ = local_d8.span_._4_4_;
          eVar11.size_._0_4_ = (int)local_d8.span_;
          (ptVar8->super__Tuple_impl<0UL,_int,_pstore::gsl::span<unsigned_char,__1L>_>).
          super__Tuple_impl<1UL,_pstore::gsl::span<unsigned_char,__1L>_>.
          super__Head_base<1UL,_pstore::gsl::span<unsigned_char,__1L>,_false>._M_head_impl.storage_.
          super_extent_type<_1L>.size_ = eVar11.size_;
          (ptVar8->super__Tuple_impl<0UL,_int,_pstore::gsl::span<unsigned_char,__1L>_>).
          super__Tuple_impl<1UL,_pstore::gsl::span<unsigned_char,__1L>_>.
          super__Head_base<1UL,_pstore::gsl::span<unsigned_char,__1L>,_false>._M_head_impl.storage_.
          data_ = (pointer)local_d8.index_;
          (ptVar8->super__Tuple_impl<0UL,_int,_pstore::gsl::span<unsigned_char,__1L>_>).
          super__Head_base<0UL,_int,_false>._M_head_impl = local_dc._M_head_impl;
        }
        else {
          (this->end_).span_ = psVar1;
          (this->end_).index_ = (ptrdiff_t)peVar2;
          pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
          span_iterator(&local_d8,span,0);
          (this->pos_).span_ =
               (span<unsigned_char,__1L> *)CONCAT44(local_d8.span_._4_4_,(int)local_d8.span_);
          (this->pos_).index_ = local_d8.index_;
        }
        this_01 = local_80;
        if (local_88 == '\0') {
          error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
          ::
          value_storage_impl<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
                    ((error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                      *)&local_a0);
        }
        else {
          error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
          ::
          error_storage_impl<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::error_code>
                    ((error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                      *)&local_a0);
        }
        span = local_a8;
        if (bVar4 && bVar5) {
          return local_b8;
        }
      }
      check_invariants(this);
      pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
      span_iterator(&local_50,(this->pos_).span_,(this->pos_).index_);
      pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
      span_iterator(&local_60,(this->end_).span_,(this->end_).index_);
      pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
      span_iterator((span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)
                    &local_a0.error_storage_,local_50.span_,local_50.index_);
      pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
      span_iterator(&local_d8,local_60.span_,local_60.index_);
      aVar3._4_4_ = local_d8.span_._4_4_;
      aVar3._0_4_ = (int)local_d8.span_;
      if (aVar3 != local_a0.storage_.__align) {
        assert_failed("span_ == rhs.span_",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                      ,0xa2);
      }
      eVar11.size_ = local_d8.index_ - local_a0._8_8_;
      if (local_c8.super_extent_type<_1L>.size_ < local_d8.index_ - local_a0._8_8_) {
        eVar11.size_ = local_c8.super_extent_type<_1L>.size_;
      }
      pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
      span_iterator(&local_70,(this->pos_).span_,(this->pos_).index_);
      if (0 < eVar11.size_) {
        local_78 = local_c8.data_;
        pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
        span_iterator(&local_40,local_70.span_,local_70.index_);
        pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
        span_iterator((span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)
                      &local_a0.error_storage_,local_40.span_,local_40.index_);
        pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator+
                  (&local_d8,(difference_type)&local_40);
        std::
        copy<pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>,unsigned_char*>
                  ((span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)
                   &local_a0.error_storage_,&local_d8,local_78);
      }
      pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator+=
                (this_01,eVar11.size_);
      local_c8 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
                 pstore::gsl::span<unsigned_char,_-1L>::subspan
                           ((span<unsigned_char,__1L> *)&local_c8,eVar11.size_,-1);
    } while (local_c8.super_extent_type<_1L>.size_.size_ != 0);
  }
  aVar3 = (anon_struct_8_0_00000001_for___align)(local_b0->storage_).data_;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)&local_a0,(long)local_c8.data_ - (long)aVar3);
  local_b8->has_error_ = false;
  local_a0._8_8_ = aVar3;
  paVar9 = (anon_struct_8_0_00000001_for___align *)
           error_or<std::tuple<int,pstore::gsl::span<unsigned_char,-1l>>>::
           value_storage_impl<pstore::error_or<std::tuple<int,pstore::gsl::span<unsigned_char,_1l>>>&,std::tuple<int,pstore::gsl::span<unsigned_char,_1l>>>
                     (local_b8);
  *paVar9 = local_a0.storage_.__align;
  paVar9[1] = (anon_struct_8_0_00000001_for___align)local_a0._8_8_;
  *(int *)(paVar9 + 2) = local_dc._M_head_impl;
  return local_b8;
}

Assistant:

auto buffered_reader<IO, RefillFunction>::get_span_impl (IO io, byte_span const & sp)
            -> error_or_n<IO, byte_span> {

            auto available = sp;
            if (push_ && sp.size () > 0) {
                sp[0] = *push_;
                push_.reset ();
                available = available.subspan (1);
            }

            while (!available.empty () && !is_eof_) {
                if (pos_ == end_) {
                    // Refill the buffer.
                    error_or_n<IO, gsl::span<std::uint8_t>::iterator> x = refill_ (io, span_);
                    if (!x) {
                        return error_or_n<IO, byte_span>{x.get_error ()};
                    }
                    io = std::move (get<0> (x));
                    auto const & end = get<1> (x);
                    if (end == span_.begin ()) {
                        // that's the end of the source data.
                        is_eof_ = true;
                        return error_or_n<IO, byte_span>{
                            in_place, io, byte_span{sp.data (), available.data () - sp.data ()}};
                    }

                    end_ = end;
                    pos_ = span_.begin ();
                }

                // If we have bytes in the buffer, copy as many as we can.

                this->check_invariants ();
                auto const to_copy = std::min (std::distance (pos_, end_), available.size ());
                std::copy_n (pos_, to_copy, available.data ());
                pos_ += to_copy;
                available = available.subspan (to_copy);
            }
            return error_or_n<IO, byte_span>{in_place, io,
                                             byte_span{sp.data (), available.data () - sp.data ()}};
        }